

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_add_element(Integer s_a,Integer idx,Integer jdx,void *val)

{
  long lVar1;
  size_t __n;
  void *pvVar2;
  _sparse_array *p_Var3;
  Integer *pIVar4;
  Integer *pIVar5;
  void *pvVar6;
  _sparse_array *p_Var7;
  long icode;
  size_t __size;
  long lVar8;
  long lVar9;
  long lVar10;
  
  icode = s_a + 1000;
  lVar1 = SPA[icode].nval;
  __n = SPA[icode].size;
  if (SPA[icode].active == 0) {
    pnga_error("(ga_sprs_array_add_element) Array not active",icode);
  }
  if (SPA[icode].ready != 0) {
    pnga_error("(ga_sprs_array_add_element) Array is already distributed",icode);
  }
  p_Var7 = SPA;
  if (SPA[icode].maxval <= lVar1) {
    pvVar2 = SPA[icode].val;
    pnga_pgroup_nodeid(SPA[icode].grp);
    p_Var3 = SPA;
    p_Var7 = SPA + icode;
    lVar10 = SPA[icode].maxval;
    __size = lVar10 << 4;
    pIVar4 = (Integer *)malloc(__size);
    pIVar5 = (Integer *)malloc(__size);
    pvVar6 = malloc(lVar10 * p_Var3[icode].size * 2);
    lVar9 = 0;
    lVar10 = 0;
    if (0 < lVar1) {
      lVar10 = lVar1;
    }
    for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 1) {
      pIVar4[lVar8] = p_Var7->idx[lVar8];
      pIVar5[lVar8] = p_Var3[icode].jdx[lVar8];
      memcpy((void *)((long)pvVar6 + lVar9),(void *)((long)pvVar2 + lVar9),__n);
      lVar9 = lVar9 + __n;
    }
    free(p_Var7->idx);
    free(SPA[icode].jdx);
    free(SPA[icode].val);
    SPA[icode].idx = pIVar4;
    SPA[icode].jdx = pIVar5;
    SPA[icode].val = pvVar6;
    p_Var7 = SPA;
    SPA[icode].maxval = SPA[icode].maxval << 1;
  }
  p_Var7[icode].idx[lVar1] = idx;
  p_Var7[icode].jdx[lVar1] = jdx;
  memcpy((void *)(lVar1 * __n + (long)p_Var7[icode].val),val,__n);
  SPA[icode].nval = SPA[icode].nval + 1;
  return;
}

Assistant:

void pnga_sprs_array_add_element(Integer s_a, Integer idx, Integer jdx, void *val)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer nval = SPA[hdl].nval;
  Integer size = SPA[hdl].size;
  Integer idx_size = sizeof(Integer);
  /* Check to see if array is active and not ready */
  if (!SPA[hdl].active) 
    pnga_error("(ga_sprs_array_add_element) Array not active",hdl);
  if (SPA[hdl].ready) 
    pnga_error("(ga_sprs_array_add_element) Array is already distributed",hdl);
  /* Check to see if existing buffers can hold another value. If not, then
   * create new buffers that are twice as large and copy old data to new
   * buffers*/
  if (nval >= SPA[hdl].maxval) {
    Integer i;
    Integer *tidx;
    Integer *tjdx;
    char *tval;
    char *oval = (char*)SPA[hdl].val;
    Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);

    tidx = (Integer*)malloc(2*SPA[hdl].maxval*sizeof(Integer));
    tjdx = (Integer*)malloc(2*SPA[hdl].maxval*sizeof(Integer));
    tval = (char*)malloc(2*SPA[hdl].maxval*SPA[hdl].size);
    /* copy data in old arrays to new, larger array */
    for (i=0; i<nval; i++) {
      tidx[i] = SPA[hdl].idx[i];
      tjdx[i] = SPA[hdl].jdx[i];
      memcpy((tval+i*size),(oval+i*size),(size_t)size);
    }
    /* get rid of old arrays */
    free(SPA[hdl].idx);
    free(SPA[hdl].jdx);
    free(SPA[hdl].val);
    /* re-assign local buffers */
    SPA[hdl].idx = tidx;
    SPA[hdl].jdx = tjdx;
    SPA[hdl].val = tval;
    /* add new values */
    SPA[hdl].maxval = 2*SPA[hdl].maxval;
  }
  /* add new value to buffers */
  SPA[hdl].idx[nval] = idx;
  SPA[hdl].jdx[nval] = jdx;
  memcpy((char*)SPA[hdl].val+size*nval,(char*)val,(size_t)size);
  SPA[hdl].nval++;
}